

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleHashCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer this_01;
  undefined1 local_1f0 [8];
  string out;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  ostringstream local_198 [8];
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar1 == 3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCryptoHash::New((cmCryptoHash *)((long)&out.field_2 + 8),pcVar4);
    this_local._7_1_ =
         std::unique_ptr::operator_cast_to_bool((unique_ptr *)(out.field_2._M_local_buf + 8));
    if (this_local._7_1_) {
      this_01 = std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::operator->
                          ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                           ((long)&out.field_2 + 8));
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,2);
      cmCryptoHash::HashString((string *)local_1f0,this_01,pvVar2);
      this_00 = (this->super_cmCommand).Makefile;
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,1);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,pvVar2,pcVar4);
      std::__cxx11::string::~string((string *)local_1f0);
    }
    std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
              ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
               ((long)&out.field_2 + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    poVar3 = std::operator<<((ostream *)local_198,(string *)pvVar2);
    std::operator<<(poVar3," requires an output variable and an input string");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&hash);
    std::__cxx11::string::~string((string *)&hash);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return this_local._7_1_;
}

Assistant:

bool cmStringCommand::HandleHashCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if (args.size() != 3) {
    std::ostringstream e;
    e << args[0] << " requires an output variable and an input string";
    this->SetError(e.str());
    return false;
  }

  std::unique_ptr<cmCryptoHash> hash(cmCryptoHash::New(args[0].c_str()));
  if (hash) {
    std::string out = hash->HashString(args[2]);
    this->Makefile->AddDefinition(args[1], out.c_str());
    return true;
  }
  return false;
#else
  std::ostringstream e;
  e << args[0] << " not available during bootstrap";
  this->SetError(e.str().c_str());
  return false;
#endif
}